

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionController_SetAssetReissuanceTest1_Test::TestBody
          (ConfidentialTransactionController_SetAssetReissuanceTest1_Test *this)

{
  bool bVar1;
  __type _Var2;
  char *pcVar3;
  char *pcVar4;
  undefined1 extraout_DL;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  IssuanceParameter param;
  BlindFactor entropy;
  BlindFactor blind_factor;
  ElementsConfidentialAddress address;
  Amount amount;
  Txid txid;
  ConfidentialTransactionController tx;
  ConfidentialTransactionController expect_tx;
  ConfidentialTransactionController tx_base;
  IssuanceParameter *pIVar5;
  IssuanceParameter *in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff748;
  undefined4 in_stack_fffffffffffff74c;
  IssuanceParameter *in_stack_fffffffffffff750;
  AssertHelper local_828;
  Message local_820;
  string local_818 [32];
  string local_7f8 [32];
  AssertionResult local_7d8;
  AssertHelper local_7c8;
  Message local_7c0;
  undefined1 local_7b8 [80];
  Txid local_768 [3];
  string local_6f8 [32];
  string local_6d8 [32];
  AssertHelper local_6b8;
  Message local_6b0;
  undefined1 local_6a8 [80];
  Txid local_658 [3];
  AssertHelper local_5e8;
  Message local_5e0;
  string local_5d8 [32];
  string local_5b8 [32];
  AssertionResult local_598;
  AssertHelper local_588;
  Message local_580 [5];
  undefined1 local_558 [311];
  allocator local_421;
  string local_420 [32];
  BlindFactor local_400;
  allocator local_3d9;
  string local_3d8 [32];
  undefined1 local_3b8 [40];
  string local_390 [32];
  ElementsConfidentialAddress local_370 [432];
  pointer local_1c0;
  undefined1 local_1b8;
  undefined1 local_1b0 [24];
  string local_198 [32];
  Txid local_178;
  ConfidentialTransactionController local_158;
  allocator local_101;
  string local_100 [32];
  ConfidentialTransactionController local_e0;
  allocator local_79;
  string local_78 [32];
  ConfidentialTransactionController local_58;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,
             "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200000000ffffffff03017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000"
             ,&local_79);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&local_58,local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_100,
             "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000029b9270003f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000"
             ,&local_101);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&local_e0,local_100);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&local_158,&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_198,"8d9123637c61017f29201542f30511bdc53ad32309df2b647128b02d54a3675e",
             (allocator *)(local_1b0 + 0x17));
  cfd::core::Txid::Txid(&local_178,local_198);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)(local_1b0 + 0x17));
  local_1c0 = (pointer)cfd::core::Amount::CreateByCoinAmount(7.0);
  local_1b8 = extraout_DL;
  local_1b0._0_8_ = local_1c0;
  local_1b0[8] = extraout_DL;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_390,
             "CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3",
             (allocator *)(local_3b8 + 0x27));
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_370,local_390);
  std::__cxx11::string::~string(local_390);
  std::allocator<char>::~allocator((allocator<char> *)(local_3b8 + 0x27));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3d8,"c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf",&local_3d9
            );
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_3b8,local_3d8);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_420,"6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306",&local_421
            );
  cfd::core::BlindFactor::BlindFactor(&local_400,local_420);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  cfd::core::IssuanceParameter::IssuanceParameter(in_stack_fffffffffffff750);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ElementsConfidentialAddress::GetLockingScript();
      cfd::core::ElementsConfidentialAddress::GetConfidentialKey();
      cfd::core::Pubkey::GetData();
      in_stack_fffffffffffff730 = (IssuanceParameter *)local_3b8;
      pIVar5 = (IssuanceParameter *)local_558;
      in_stack_fffffffffffff748 = 0;
      cfd::ConfidentialTransactionController::SetAssetReissuance
                ((Txid *)(local_558 + 0x50),(uint)&local_158,(Amount *)&local_178,(Script *)0x2,
                 (ByteData *)local_1b0,(BlindFactor *)(local_558 + 0x18),(BlindFactor *)pIVar5,
                 SUB81(in_stack_fffffffffffff730,0),false);
      cfd::core::IssuanceParameter::operator=(in_stack_fffffffffffff730,pIVar5);
      cfd::core::IssuanceParameter::~IssuanceParameter(in_stack_fffffffffffff730);
      cfd::core::ByteData::~ByteData((ByteData *)0x1c94c9);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x1c94d6);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff730);
    }
  }
  else {
    testing::Message::Message(local_580);
    testing::internal::AssertHelper::AssertHelper
              (&local_588,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x83,
               "Expected: (param = tx.SetAssetReissuance(txid, 2, amount, address.GetLockingScript(), address.GetConfidentialKey().GetData(), blind_factor, entropy, false, false)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_588,local_580);
    testing::internal::AssertHelper::~AssertHelper(&local_588);
    testing::Message::~Message((Message *)0x1c9836);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_598,"tx.GetHex().c_str()","expect_tx.GetHex().c_str()",pcVar3,pcVar4
            );
  std::__cxx11::string::~string(local_5d8);
  std::__cxx11::string::~string(local_5b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_598);
  if (!bVar1) {
    testing::Message::Message(&local_5e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1c99ad);
    testing::internal::AssertHelper::AssertHelper
              (&local_5e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x84,pcVar3);
    testing::internal::AssertHelper::operator=(&local_5e8,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper(&local_5e8);
    testing::Message::~Message((Message *)0x1c9a0a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c9a62);
  cfd::ConfidentialTransactionController::operator=(&local_158,&local_58);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ElementsConfidentialAddress::GetLockingScript();
      cfd::core::ByteData::ByteData((ByteData *)local_6a8);
      in_stack_fffffffffffff730 = (IssuanceParameter *)local_3b8;
      in_stack_fffffffffffff748 = 0;
      cfd::ConfidentialTransactionController::SetAssetReissuance
                (local_658,(uint)&local_158,(Amount *)&local_178,(Script *)0x2,(ByteData *)local_1b0
                 ,(BlindFactor *)(local_6a8 + 0x18),(BlindFactor *)local_6a8,
                 SUB81(in_stack_fffffffffffff730,0),false);
      cfd::core::IssuanceParameter::~IssuanceParameter(in_stack_fffffffffffff730);
      cfd::core::ByteData::~ByteData((ByteData *)0x1c9b51);
      cfd::core::Script::~Script((Script *)in_stack_fffffffffffff730);
    }
  }
  else {
    testing::Message::Message(&local_6b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_6b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x8c,
               "Expected: (tx.SetAssetReissuance(txid, 2, amount, address.GetLockingScript(), ByteData(), blind_factor, entropy, true, false)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_6b8,&local_6b0);
    testing::internal::AssertHelper::~AssertHelper(&local_6b8);
    testing::Message::~Message((Message *)0x1c9c60);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffff750,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
  std::__cxx11::string::~string(local_6f8);
  std::__cxx11::string::~string(local_6d8);
  if (_Var2) {
    cfd::ConfidentialTransactionController::operator=(&local_158,&local_58);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::ElementsConfidentialAddress::GetLockingScript();
        cfd::core::ByteData::ByteData((ByteData *)local_7b8);
        in_stack_fffffffffffff730 = (IssuanceParameter *)local_3b8;
        cfd::ConfidentialTransactionController::SetAssetReissuance
                  (local_768,(uint)&local_158,(Amount *)&local_178,(Script *)0x2,
                   (ByteData *)local_1b0,(BlindFactor *)(local_7b8 + 0x18),(BlindFactor *)local_7b8,
                   SUB81(in_stack_fffffffffffff730,0),false);
        cfd::core::IssuanceParameter::~IssuanceParameter(in_stack_fffffffffffff730);
        cfd::core::ByteData::~ByteData((ByteData *)0x1c9e08);
        cfd::core::Script::~Script((Script *)in_stack_fffffffffffff730);
      }
    }
    else {
      testing::Message::Message(&local_7c0);
      testing::internal::AssertHelper::AssertHelper
                (&local_7c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
                 ,0x93,
                 "Expected: (tx.SetAssetReissuance(txid, 2, amount, address.GetLockingScript(), ByteData(), blind_factor, entropy, true, false)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=(&local_7c8,&local_7c0);
      testing::internal::AssertHelper::~AssertHelper(&local_7c8);
      testing::Message::~Message((Message *)0x1c9f2b);
    }
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTRNE
            ((internal *)&local_7d8,"tx.GetHex().c_str()","expect_tx.GetHex().c_str()",pcVar3,pcVar4
            );
  std::__cxx11::string::~string(local_818);
  std::__cxx11::string::~string(local_7f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7d8);
  if (!bVar1) {
    testing::Message::Message(&local_820);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1ca0a4);
    testing::internal::AssertHelper::AssertHelper
              (&local_828,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x95,pcVar3);
    testing::internal::AssertHelper::operator=(&local_828,&local_820);
    testing::internal::AssertHelper::~AssertHelper(&local_828);
    testing::Message::~Message((Message *)0x1ca101);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ca156);
  cfd::core::IssuanceParameter::~IssuanceParameter(in_stack_fffffffffffff730);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x1ca170);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x1ca17d);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)in_stack_fffffffffffff730);
  cfd::core::Txid::~Txid((Txid *)0x1ca197);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)in_stack_fffffffffffff730);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)in_stack_fffffffffffff730);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)in_stack_fffffffffffff730);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, SetAssetReissuanceTest1)
{
    ConfidentialTransactionController tx_base(
        "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200000000ffffffff03017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000");
    ConfidentialTransactionController expect_tx(
        "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000029b9270003f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000");

    // not blind
    ConfidentialTransactionController tx(tx_base);
    Txid txid("8d9123637c61017f29201542f30511bdc53ad32309df2b647128b02d54a3675e");
    Amount amount = Amount::CreateByCoinAmount(7.0);
    ElementsConfidentialAddress address("CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3");
    BlindFactor blind_factor("c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf");
    BlindFactor entropy("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306");

    IssuanceParameter param;
    EXPECT_NO_THROW(
        (param = tx.SetAssetReissuance(txid, 2, amount,
                                       address.GetLockingScript(),
                                       address.GetConfidentialKey().GetData(), blind_factor,
                                       entropy, false, false)));
    EXPECT_STREQ(tx.GetHex().c_str(), expect_tx.GetHex().c_str());

    // txout randomize
    tx = tx_base;
    EXPECT_NO_THROW(
        (tx.SetAssetReissuance(txid, 2, amount,
                               address.GetLockingScript(),
                               ByteData(), blind_factor,
                               entropy, true, false)));
    if (tx.GetHex() == expect_tx.GetHex()) {
      tx = tx_base;
      EXPECT_NO_THROW(
          (tx.SetAssetReissuance(txid, 2, amount,
                                 address.GetLockingScript(),
                                 ByteData(), blind_factor,
                                 entropy, true, false)));
    }
    EXPECT_STRNE(tx.GetHex().c_str(), expect_tx.GetHex().c_str());
}